

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomvar.cpp
# Opt level: O1

void __thiscall MetaSim::DetVar::DetVar(DetVar *this,double *a,int s)

{
  iterator __position;
  ulong uVar1;
  
  (this->super_RandomVar)._vptr_RandomVar = (_func_int **)&PTR___cxa_pure_virtual_0017f8f0;
  (this->super_RandomVar)._gen = (RandomGen *)RandomVar::_pstdgen;
  __regrandvar_init();
  (this->super_RandomVar)._vptr_RandomVar = (_func_int **)&PTR_clone_0017f930;
  (this->_array).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->_array).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->_array).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  if (0 < s) {
    uVar1 = (ulong)(uint)s;
    do {
      __position._M_current =
           (this->_array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->_array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&this->_array,__position,a);
      }
      else {
        *__position._M_current = *a;
        (this->_array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      a = a + 1;
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
  }
  this->_count = 0;
  return;
}

Assistant:

DetVar::DetVar(double *a, int s)
    {
        for (int i = 0; i < s; ++i) 
            _array.push_back(a[i]);
        _count = 0;
    }